

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void dead_code_elimination(gen_ctx_t gen_ctx)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bitmap_t src2;
  bb_insn_t_conflict pbVar4;
  bb_insn_t_conflict pbVar5;
  bb_insn_t_conflict pbVar6;
  bb_t_conflict local_88;
  bb_t_conflict bb;
  bitmap_t global_hard_regs;
  long dead_insns_num;
  insn_var_iterator_t insn_var_iter;
  bitmap_t live;
  int dead_p;
  int reg_def_p;
  int op_num;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_reg_t var;
  bb_insn_t_conflict prev_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t nop_insn;
  MIR_insn_t insn;
  gen_ctx_t gen_ctx_local;
  
  global_hard_regs = (bitmap_t)0x0;
  insn = (MIR_insn_t)gen_ctx;
  src2 = (bitmap_t)
         _MIR_get_module_global_var_hard_regs(gen_ctx->ctx,gen_ctx->curr_func_item->module);
  if (*(int *)&(insn->insn_link).prev == 0) {
    __assert_fail("gen_ctx->optimize_level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x23b8,"void dead_code_elimination(gen_ctx_t)");
  }
  if ((*(long *)&insn->field_0x18 != 0) && (1 < *(int *)&insn->ops[0].data)) {
    fprintf(*(FILE **)&insn->field_0x18,"+++++++++++++Dead code elimination:\n");
  }
  insn_var_iter.op_part_num = (size_t)bitmap_create2(0x100);
  local_88 = DLIST_bb_t_head((DLIST_bb_t *)(*(long *)&insn[3].field_0x18 + 0x18));
  do {
    if (local_88 == (bb_t_conflict)0x0) {
      bitmap_destroy((bitmap_t)insn_var_iter.op_part_num);
      if ((*(long *)&insn->field_0x18 != 0) && (0 < *(int *)&insn->ops[0].data)) {
        fprintf(*(FILE **)&insn->field_0x18,"%5ld removed dead insns\n",global_hard_regs);
      }
      return;
    }
    bitmap_copy((bitmap_t)insn_var_iter.op_part_num,local_88->out);
    prev_bb_insn = DLIST_bb_insn_t_tail(&local_88->bb_insns);
    while (prev_bb_insn != (bb_insn_t_conflict)0x0) {
      _early_clobbered_hard_reg1 = DLIST_bb_insn_t_prev(prev_bb_insn);
      nop_insn = prev_bb_insn->insn;
      bVar1 = false;
      bVar2 = true;
      insn_var_iterator_init((insn_var_iterator_t *)&dead_insns_num,nop_insn);
      while (iVar3 = output_insn_var_iterator_next
                               ((gen_ctx_t)insn,(insn_var_iterator_t *)&dead_insns_num,
                                &early_clobbered_hard_reg2,&dead_p), iVar3 != 0) {
        bVar1 = true;
        iVar3 = bitmap_clear_bit_p((bitmap_t)insn_var_iter.op_part_num,
                                   (ulong)early_clobbered_hard_reg2);
        if ((iVar3 != 0) ||
           (iVar3 = bitmap_bit_p(*(const_bitmap_t *)((long)&insn->ops[0].u + 0x10),
                                 (ulong)early_clobbered_hard_reg2), iVar3 != 0)) {
          bVar2 = false;
        }
      }
      if (!bVar1) {
        bVar2 = false;
      }
      if (((((((bVar2) &&
              (iVar3 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&nop_insn->field_0x18),
              iVar3 == 0)) && ((int)*(undefined8 *)&nop_insn->field_0x18 != 0xab)) &&
            (((int)*(undefined8 *)&nop_insn->field_0x18 != 0xac &&
             ((int)*(undefined8 *)&nop_insn->field_0x18 != 0xad)))) &&
           (((int)*(undefined8 *)&nop_insn->field_0x18 != 0xae &&
            (((int)*(undefined8 *)&nop_insn->field_0x18 != 0xaf &&
             ((int)*(undefined8 *)&nop_insn->field_0x18 != 0xb2)))))) &&
          ((int)*(undefined8 *)&nop_insn->field_0x18 != 0xb0)) &&
         ((int)*(undefined8 *)&nop_insn->field_0x18 != 0xb3)) {
        iVar3 = MIR_overflow_insn_code_p((MIR_insn_code_t)*(undefined8 *)&nop_insn->field_0x18);
        if (iVar3 != 0) {
          pbVar4 = DLIST_bb_insn_t_next(prev_bb_insn);
          iVar3 = reachable_bo_exists_p(pbVar4);
          if (iVar3 != 0) goto LAB_0013f158;
        }
        if (((*(ushort *)&nop_insn->ops[0].field_0x8 & 0xff) == 2) &&
           ((nop_insn->ops[0].u.reg == 5 || (nop_insn->ops[0].u.reg == 4)))) goto LAB_0013f158;
        if ((*(long *)&insn->field_0x18 != 0) && (1 < *(int *)&insn->ops[0].data)) {
          fprintf(*(FILE **)&insn->field_0x18,"  Removing dead insn %-5lu",
                  (ulong)prev_bb_insn->index);
          MIR_output_insn((MIR_context_t)insn->data,*(FILE **)&insn->field_0x18,nop_insn,
                          *(MIR_func_t *)((long)&((insn->insn_link).next)->ops[0].u + 0x10),1);
        }
        pbVar5 = DLIST_bb_insn_t_head(&local_88->bb_insns);
        pbVar6 = DLIST_bb_insn_t_tail(&local_88->bb_insns);
        pbVar4 = prev_bb_insn;
        if (pbVar5 == pbVar6) {
          pbVar5 = DLIST_bb_insn_t_head(&local_88->bb_insns);
          if (pbVar4 != pbVar5) {
            __assert_fail("bb_insn == (DLIST_bb_insn_t_head (&(bb->bb_insns)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x23d3,"void dead_code_elimination(gen_ctx_t)");
          }
          bb_insn = (bb_insn_t_conflict)
                    MIR_new_insn_arr((MIR_context_t)insn->data,MIR_USE,0,(MIR_op_t *)0x0);
          if ((*(long *)&insn->field_0x18 != 0) && (1 < *(int *)&insn->ops[0].data)) {
            fprintf(*(FILE **)&insn->field_0x18,"  Adding nop to keep bb%lu non-empty: ",
                    local_88->index);
            MIR_output_insn((MIR_context_t)insn->data,*(FILE **)&insn->field_0x18,
                            (MIR_insn_t_conflict)bb_insn,
                            *(MIR_func_t *)((long)&((insn->insn_link).next)->ops[0].u + 0x10),1);
          }
          gen_add_insn_after((gen_ctx_t)insn,nop_insn,(MIR_insn_t)bb_insn);
        }
        gen_delete_insn((gen_ctx_t)insn,nop_insn);
        global_hard_regs = (bitmap_t)((long)&global_hard_regs->els_num + 1);
      }
      else {
LAB_0013f158:
        iVar3 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&nop_insn->field_0x18);
        if ((iVar3 != 0) &&
           (bitmap_and_compl((bitmap_t)insn_var_iter.op_part_num,(bitmap_t)insn_var_iter.op_part_num
                             ,(bitmap_t)insn[3].insn_link.prev), src2 != (bitmap_t)0x0)) {
          bitmap_ior((bitmap_t)insn_var_iter.op_part_num,(bitmap_t)insn_var_iter.op_part_num,src2);
        }
        insn_var_iterator_init((insn_var_iterator_t *)&dead_insns_num,nop_insn);
        while (iVar3 = input_insn_var_iterator_next
                                 ((gen_ctx_t)insn,(insn_var_iterator_t *)&dead_insns_num,
                                  &early_clobbered_hard_reg2,&dead_p), iVar3 != 0) {
          bitmap_set_bit_p((bitmap_t)insn_var_iter.op_part_num,(ulong)early_clobbered_hard_reg2);
        }
        target_get_early_clobbered_hard_regs(nop_insn,(MIR_reg_t *)&op_num,(MIR_reg_t *)&reg_def_p);
        if (op_num != -1) {
          bitmap_clear_bit_p((bitmap_t)insn_var_iter.op_part_num,(ulong)(uint)op_num);
        }
        if (reg_def_p != -1) {
          bitmap_clear_bit_p((bitmap_t)insn_var_iter.op_part_num,(ulong)(uint)reg_def_p);
        }
        iVar3 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&nop_insn->field_0x18);
        if (iVar3 != 0) {
          bitmap_ior((bitmap_t)insn_var_iter.op_part_num,(bitmap_t)insn_var_iter.op_part_num,
                     prev_bb_insn->call_hard_reg_args);
        }
      }
      prev_bb_insn = _early_clobbered_hard_reg1;
    }
    local_88 = DLIST_bb_t_next(local_88);
  } while( true );
}

Assistant:

static void dead_code_elimination (gen_ctx_t gen_ctx) {
  MIR_insn_t insn, nop_insn;
  bb_insn_t bb_insn, prev_bb_insn;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  int op_num, reg_def_p, dead_p;
  bitmap_t live;
  insn_var_iterator_t insn_var_iter;
  long dead_insns_num = 0;
  bitmap_t global_hard_regs
    = _MIR_get_module_global_var_hard_regs (gen_ctx->ctx, curr_func_item->module);

  gen_assert (optimize_level > 0);
  DEBUG (2, { fprintf (debug_file, "+++++++++++++Dead code elimination:\n"); });
  live = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_copy (live, bb->live_out);
    for (bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = prev_bb_insn) {
      prev_bb_insn = DLIST_PREV (bb_insn_t, bb_insn);
      insn = bb_insn->insn;
      reg_def_p = FALSE;
      dead_p = TRUE;
      FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        reg_def_p = TRUE;
        if (bitmap_clear_bit_p (live, var) || bitmap_bit_p (addr_regs, var)) dead_p = FALSE;
      }
      if (!reg_def_p) dead_p = FALSE;
      if (dead_p && !MIR_call_code_p (insn->code) && insn->code != MIR_RET && insn->code != MIR_JRET
          && insn->code != MIR_ALLOCA && insn->code != MIR_BSTART && insn->code != MIR_BEND
          && insn->code != MIR_VA_START && insn->code != MIR_VA_ARG && insn->code != MIR_VA_END
          && !(MIR_overflow_insn_code_p (insn->code)
               && reachable_bo_exists_p (DLIST_NEXT (bb_insn_t, bb_insn)))
          && !(insn->ops[0].mode == MIR_OP_VAR
               && (insn->ops[0].u.var == FP_HARD_REG || insn->ops[0].u.var == SP_HARD_REG))) {
        DEBUG (2, {
          fprintf (debug_file, "  Removing dead insn %-5lu", (unsigned long) bb_insn->index);
          MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
        });
        if (DLIST_HEAD (bb_insn_t, bb->bb_insns) == DLIST_TAIL (bb_insn_t, bb->bb_insns)) {
          gen_assert (bb_insn == DLIST_HEAD (bb_insn_t, bb->bb_insns));
          nop_insn = MIR_new_insn_arr (gen_ctx->ctx, MIR_USE, 0, NULL);
          DEBUG (2, {
            fprintf (debug_file,
                     "  Adding nop to keep bb%lu non-empty: ", (unsigned long) bb->index);
            MIR_output_insn (gen_ctx->ctx, debug_file, nop_insn, curr_func_item->u.func, TRUE);
          });
          gen_add_insn_after (gen_ctx, insn, nop_insn);
        }
        gen_delete_insn (gen_ctx, insn);
        dead_insns_num++;
        continue;
      }
      if (MIR_call_code_p (insn->code)) {
        bitmap_and_compl (live, live, call_used_hard_regs[MIR_T_UNDEF]);
        if (global_hard_regs != NULL) bitmap_ior (live, live, global_hard_regs);
      }
      FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        bitmap_set_bit_p (live, var);
      }
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg1);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg2);
      if (MIR_call_code_p (insn->code)) bitmap_ior (live, live, bb_insn->call_hard_reg_args);
    }
  }
  bitmap_destroy (live);
  DEBUG (1, { fprintf (debug_file, "%5ld removed dead insns\n", dead_insns_num); });
}